

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O0

void __thiscall QDecompressHelper::feed(QDecompressHelper *this,QByteDataBuffer *buffer)

{
  long lVar1;
  bool bVar2;
  qint64 qVar3;
  QByteDataBuffer *in_RSI;
  QDecompressHelper *in_RDI;
  long in_FS_OFFSET;
  QDecompressHelper *this_00;
  QByteDataBuffer *in_stack_ffffffffffffffe0;
  QDecompressHelper *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  qVar3 = QByteDataBuffer::byteAmount(in_RSI);
  in_RDI->totalCompressedBytes = qVar3 + in_RDI->totalCompressedBytes;
  QByteDataBuffer::append(in_stack_ffffffffffffffe0,&this_00->compressedDataBuffer);
  bVar2 = countInternal(this_00,in_RSI);
  if (!bVar2) {
    bVar2 = QString::isEmpty((QString *)0x2a934e);
    if ((bVar2) &&
       (bVar2 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_> *
                           )0x2a9361), bVar2)) {
      std::unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_>::operator->
                ((unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_> *)0x2a9374)
      ;
      errorString(in_RDI);
      QString::operator=((QString *)in_RSI,(QString *)in_RDI);
      QString::~QString((QString *)0x2a939d);
    }
    clear(in_stack_fffffffffffffff0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDecompressHelper::feed(const QByteDataBuffer &buffer)
{
    Q_ASSERT(contentEncoding != None);
    totalCompressedBytes += buffer.byteAmount();
    compressedDataBuffer.append(buffer);
    if (!countInternal(buffer)) {
        if (errorStr.isEmpty() && countHelper)
            errorStr = countHelper->errorString();
        clear(); // If our counting brother failed then so will we :|
    }
}